

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# announce_entry.hpp
# Opt level: O2

announce_endpoint * __thiscall
libtorrent::aux::announce_endpoint::operator=(announce_endpoint *this,announce_endpoint *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar1 = *(undefined8 *)&(param_1->local_endpoint).impl_.data_;
  uVar2 = *(undefined8 *)((long)&(param_1->local_endpoint).impl_.data_ + 8);
  uVar3 = *(undefined8 *)((long)&(param_1->local_endpoint).impl_.data_ + 0x14);
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0xc) =
       *(undefined8 *)((long)&(param_1->local_endpoint).impl_.data_ + 0xc);
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 0x14) = uVar3;
  *(undefined8 *)&(this->local_endpoint).impl_.data_ = uVar1;
  *(undefined8 *)((long)&(this->local_endpoint).impl_.data_ + 8) = uVar2;
  ::std::array<libtorrent::aux::announce_infohash,_2UL>::operator=
            (&(this->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>,
             &(param_1->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>);
  this->field_0xb0 = this->field_0xb0 & 0xfe | param_1->field_0xb0 & 1;
  ::std::__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> *)
             &this->socket,
             (__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> *)
             &param_1->socket);
  return this;
}

Assistant:

struct TORRENT_EXTRA_EXPORT announce_endpoint
	{
		// internal
		announce_endpoint(aux::listen_socket_handle const& s, bool completed);

		// the local endpoint of the listen interface associated with this endpoint
		tcp::endpoint local_endpoint;

		// torrents can be announced using multiple info hashes
		// for different protocol versions

		// info_hashes[0] is the v1 info hash (SHA1)
		// info_hashes[1] is the v2 info hash (truncated SHA-256)
		aux::array<announce_infohash, num_protocols, protocol_version> info_hashes;

		// reset announce counters and clears the started sent flag.
		// The announce_endpoint will look like we've never talked to
		// the tracker.
		void reset();

		// set to false to not announce from this endpoint
		bool enabled : 1;

		// internal
		aux::listen_socket_handle socket;
	}